

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

FileData * __thiscall GGSock::FileServer::getFileData(FileServer *this,TURI *uri)

{
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var1;
  FileData *pFVar2;
  long lVar3;
  pointer __s2;
  size_t sVar4;
  size_t __n;
  int iVar5;
  pthread_mutex_t *__mutex;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  FileData *local_38;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  pFVar2 = *(FileData **)
            &((_Var1._M_head_impl)->files).
             super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
  ;
  uVar6 = (int)((long)*(pointer *)((long)&(_Var1._M_head_impl)->files + 8) - (long)pFVar2 >> 3) *
          -0x3b13b13b;
  bVar8 = 0 < (int)uVar6;
  if (0 < (int)uVar6) {
    lVar3 = *(long *)&((_Var1._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_>;
    __s2 = (uri->_M_dataplus)._M_p;
    sVar4 = uri->_M_string_length;
    uVar7 = 0;
    uri = (TURI *)pFVar2;
    do {
      if (((*(ulong *)(lVar3 + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0) &&
         (__n = (((FileData *)uri)->info).uri._M_string_length, __n == sVar4)) {
        if (__n == 0) break;
        iVar5 = bcmp((((FileData *)uri)->info).uri._M_dataplus._M_p,__s2,__n);
        if (iVar5 == 0) {
          uri = (TURI *)(pFVar2 + uVar7);
          break;
        }
      }
      uVar7 = uVar7 + 1;
      bVar8 = uVar7 < (uVar6 & 0x7fffffff);
      uri = (TURI *)((long)uri + 0x68);
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  pthread_mutex_unlock(__mutex);
  if (!bVar8) {
    if (getFileData(std::__cxx11::string_const&)::empty == '\0') {
      getFileData();
      uri = (TURI *)local_38;
    }
    else {
      uri = (TURI *)&getFileData::empty;
    }
  }
  return (FileData *)uri;
}

Assistant:

const FileServer::FileData & FileServer::getFileData(const TURI & uri) const {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->files.size(); ++i) {
            if (m_impl->fileUsed[i] == false) {
                continue;
            }

            if (m_impl->files[i].info.uri != uri) {
                continue;
            }

            return m_impl->files[i];
        }
    }

    static FileData empty;
    return empty;
}